

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
__thiscall
duckdb::JoinFilterPushdownInfo::GetGlobalState
          (JoinFilterPushdownInfo *this,ClientContext *context,PhysicalOperator *op)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::GlobalUngroupedAggregateState_*,_false> __p;
  pointer in_RAX;
  DynamicTableFilterSet *this_00;
  Allocator *args;
  __uniq_ptr_impl<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>_>
  *this_01;
  PhysicalOperator *in_RCX;
  JoinFilterPushdownFilter *info;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Head_base<0UL,_duckdb::GlobalUngroupedAggregateState_*,_false> local_38;
  
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&context->interrupted;
  local_38._M_head_impl = in_RAX;
  for (this_02 = (context->db).internal.
                 super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi; this_02 != p_Var1;
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this_02[2]._M_use_count) {
    this_00 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->
                        ((shared_ptr<duckdb::DynamicTableFilterSet,_true> *)this_02);
    DynamicTableFilterSet::ClearFilters(this_00,in_RCX);
  }
  make_uniq<duckdb::JoinFilterGlobalState>();
  args = BufferAllocator::Get((ClientContext *)op);
  make_uniq<duckdb::GlobalUngroupedAggregateState,duckdb::Allocator&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>const&>
            ((duckdb *)&local_38,args,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&context->logger);
  this_01 = (__uniq_ptr_impl<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>_>
             *)unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
               ::operator->((unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
                             *)this);
  __p._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (GlobalUngroupedAggregateState *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>_>
  ::reset(this_01,__p._M_head_impl);
  ::std::
  unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>_>
  ::~unique_ptr((unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>_>
                 *)&local_38);
  return (unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
          )(unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
            )this;
}

Assistant:

unique_ptr<JoinFilterGlobalState> JoinFilterPushdownInfo::GetGlobalState(ClientContext &context,
                                                                         const PhysicalOperator &op) const {
	// clear any previously set filters
	// we can have previous filters for this operator in case of e.g. recursive CTEs
	for (auto &info : probe_info) {
		info.dynamic_filters->ClearFilters(op);
	}
	auto result = make_uniq<JoinFilterGlobalState>();
	result->global_aggregate_state =
	    make_uniq<GlobalUngroupedAggregateState>(BufferAllocator::Get(context), min_max_aggregates);
	return result;
}